

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseTools.h
# Opt level: O0

shared_ptr<asio::io_context::strand>
tonk::MakeSharedNoThrow<asio::io_context::strand,asio::io_context&>(io_context *args)

{
  void *pvVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  strand *in_RDI;
  shared_ptr<asio::io_context::strand> sVar2;
  strand *this;
  
  this = in_RDI;
  pvVar1 = operator_new(0x10,(nothrow_t *)&std::nothrow);
  if (pvVar1 != (void *)0x0) {
    asio::io_context::strand::strand(this,(io_context *)in_RDI);
  }
  std::shared_ptr<asio::io_context::strand>::shared_ptr<asio::io_context::strand,void>
            ((shared_ptr<asio::io_context::strand> *)this,in_RDI);
  sVar2.super___shared_ptr<asio::io_context::strand,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<asio::io_context::strand,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<asio::io_context::strand>)
         sVar2.super___shared_ptr<asio::io_context::strand,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

inline std::shared_ptr<T> MakeSharedNoThrow(Args&&... args) {
    return std::shared_ptr<T>(new(std::nothrow) T(std::forward<Args>(args)...));
}